

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3WriteSegdir(Fts3Table *p,sqlite3_int64 iLevel,int iIdx,sqlite3_int64 iStartBlock,
                   sqlite3_int64 iLeafEndBlock,sqlite3_int64 iEndBlock,sqlite3_int64 nLeafData,
                   char *zRoot,int nRoot)

{
  long lVar1;
  char *pcVar2;
  sqlite3_stmt *in_RCX;
  undefined4 in_EDX;
  sqlite3_stmt **in_R8;
  sqlite3_value **in_R9;
  long in_FS_OFFSET;
  long in_stack_00000008;
  char *zEnd;
  int rc;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  int i;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  int local_14;
  
  i = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = fts3SqlStmt((Fts3Table *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
                         (int)((ulong)in_RCX >> 0x20),in_R8,in_R9);
  if (local_14 == 0) {
    sqlite3_bind_int64((sqlite3_stmt *)(ulong)in_stack_ffffffffffffffb0,i,
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    sqlite3_bind_int((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(local_14,in_stack_ffffffffffffffb0),i,
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(local_14,in_stack_ffffffffffffffb0),i,
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (in_stack_00000008 == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)CONCAT44(local_14,in_stack_ffffffffffffffb0),i,
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    }
    else {
      pcVar2 = sqlite3_mprintf("%lld %lld",in_R9,in_stack_00000008);
      if (pcVar2 == (char *)0x0) {
        local_14 = 7;
        goto LAB_00257071;
      }
      sqlite3_bind_text((sqlite3_stmt *)CONCAT44(local_14,in_stack_ffffffffffffffb0),
                        (int)((ulong)pcVar2 >> 0x20),
                        (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff9c,(_func_void_void_ptr *)0x257022);
      i = (int)((ulong)pcVar2 >> 0x20);
    }
    sqlite3_bind_blob((sqlite3_stmt *)CONCAT44(local_14,in_stack_ffffffffffffffb0),i,
                      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c,(_func_void_void_ptr *)0x257042);
    sqlite3_step(in_RCX);
    local_14 = sqlite3_reset((sqlite3_stmt *)CONCAT44(local_14,in_stack_ffffffffffffffb0));
    sqlite3_bind_null((sqlite3_stmt *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff9c);
  }
LAB_00257071:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static int fts3WriteSegdir(
  Fts3Table *p,                   /* Virtual table handle */
  sqlite3_int64 iLevel,           /* Value for "level" field (absolute level) */
  int iIdx,                       /* Value for "idx" field */
  sqlite3_int64 iStartBlock,      /* Value for "start_block" field */
  sqlite3_int64 iLeafEndBlock,    /* Value for "leaves_end_block" field */
  sqlite3_int64 iEndBlock,        /* Value for "end_block" field */
  sqlite3_int64 nLeafData,        /* Bytes of leaf data in segment */
  char *zRoot,                    /* Blob value for "root" field */
  int nRoot                       /* Number of bytes in buffer zRoot */
){
  sqlite3_stmt *pStmt;
  int rc = fts3SqlStmt(p, SQL_INSERT_SEGDIR, &pStmt, 0);
  if( rc==SQLITE_OK ){
    sqlite3_bind_int64(pStmt, 1, iLevel);
    sqlite3_bind_int(pStmt, 2, iIdx);
    sqlite3_bind_int64(pStmt, 3, iStartBlock);
    sqlite3_bind_int64(pStmt, 4, iLeafEndBlock);
    if( nLeafData==0 ){
      sqlite3_bind_int64(pStmt, 5, iEndBlock);
    }else{
      char *zEnd = sqlite3_mprintf("%lld %lld", iEndBlock, nLeafData);
      if( !zEnd ) return SQLITE_NOMEM;
      sqlite3_bind_text(pStmt, 5, zEnd, -1, sqlite3_free);
    }
    sqlite3_bind_blob(pStmt, 6, zRoot, nRoot, SQLITE_STATIC);
    sqlite3_step(pStmt);
    rc = sqlite3_reset(pStmt);
    sqlite3_bind_null(pStmt, 6);
  }
  return rc;
}